

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

void gostcrypt(gost_ctx *c,byte *in,byte *out)

{
  int iVar1;
  word32 wVar2;
  int iVar3;
  word32 wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  
  uVar12 = *(uint *)in;
  uVar9 = *(uint *)(in + 4);
  iVar1 = c->mask[0] + c->key[0];
  wVar2 = f(c,iVar1 + uVar12);
  iVar3 = c->mask[1] + c->key[1];
  wVar4 = f(c,iVar3 + (wVar2 ^ uVar9));
  uVar12 = wVar4 ^ uVar12;
  iVar5 = c->mask[2] + c->key[2];
  wVar4 = f(c,iVar5 + uVar12);
  uVar9 = wVar4 ^ wVar2 ^ uVar9;
  iVar6 = c->mask[3] + c->key[3];
  wVar2 = f(c,iVar6 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  iVar7 = c->mask[4] + c->key[4];
  wVar2 = f(c,iVar7 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  iVar8 = c->mask[5] + c->key[5];
  wVar2 = f(c,iVar8 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  iVar10 = c->mask[6] + c->key[6];
  wVar2 = f(c,iVar10 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  iVar11 = c->mask[7] + c->key[7];
  wVar2 = f(c,uVar9 + iVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar1 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar3 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar5 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar6 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar7 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar8 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar10 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,uVar9 + iVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar1 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar3 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar5 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar6 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar7 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar8 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar10 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar11 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar11 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar10 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar8 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar7 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar6 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar5 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar3 + uVar12);
  uVar9 = wVar2 ^ uVar9;
  wVar2 = f(c,iVar1 + uVar9);
  uVar12 = wVar2 ^ uVar12;
  *out = (byte)uVar9;
  out[1] = (byte)(uVar9 >> 8);
  out[2] = (byte)(uVar9 >> 0x10);
  out[3] = (byte)(uVar9 >> 0x18);
  out[4] = (byte)uVar12;
  out[5] = (byte)(uVar12 >> 8);
  out[6] = (byte)(uVar12 >> 0x10);
  out[7] = (byte)(uVar12 >> 0x18);
  return;
}

Assistant:

void gostcrypt(gost_ctx * c, const byte * in, byte * out)
{
    register word32 n1, n2;     /* As named in the GOST */
    n1 = in[0] | (in[1] << 8) | (in[2] << 16) | ((word32) in[3] << 24);
    n2 = in[4] | (in[5] << 8) | (in[6] << 16) | ((word32) in[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    out[0] = (byte) (n2 & 0xff);
    out[1] = (byte) ((n2 >> 8) & 0xff);
    out[2] = (byte) ((n2 >> 16) & 0xff);
    out[3] = (byte) (n2 >> 24);
    out[4] = (byte) (n1 & 0xff);
    out[5] = (byte) ((n1 >> 8) & 0xff);
    out[6] = (byte) ((n1 >> 16) & 0xff);
    out[7] = (byte) (n1 >> 24);
}